

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O0

void __thiscall TcpConn::OnData(TcpConn *this)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  ssize_t sVar5;
  int *piVar6;
  ostream *poVar7;
  undefined4 extraout_var_00;
  uint uVar8;
  size_t in_RCX;
  BufferChain *pBStack_18;
  int ret;
  BufferChain *buff;
  TcpConn *this_local;
  
  iVar2 = (*(this->super_PollObj)._vptr_PollObj[9])();
  pBStack_18 = (BufferChain *)CONCAT44(extraout_var,iVar2);
  while( true ) {
    pcVar4 = BufferChain::GetWriteAddr(pBStack_18);
    uVar1 = BufferChain::GetCanWriteCount(pBStack_18);
    sVar5 = TcpSocket::read(&this->m_socket,(int)pcVar4,(void *)(ulong)uVar1,in_RCX);
    iVar2 = (int)sVar5;
    if (iVar2 < 0) break;
    if (iVar2 == 0) {
      Buffer::AddReaChain(&this->super_Buffer,pBStack_18);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
      poVar7 = std::operator<<(poVar7,":");
      piVar6 = __errno_location();
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*piVar6);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      (*(this->super_PollObj)._vptr_PollObj[8])();
      return;
    }
    uVar8 = (uint)pBStack_18->write + iVar2;
    in_RCX = (size_t)uVar8;
    pBStack_18->write = (uint16_t)uVar8;
    uVar1 = BufferChain::GetCanWriteCount(pBStack_18);
    if (uVar1 == 0) {
      Buffer::AddReaChain(&this->super_Buffer,pBStack_18);
      iVar3 = (*(this->super_PollObj)._vptr_PollObj[9])();
      pBStack_18 = (BufferChain *)CONCAT44(extraout_var_00,iVar3);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"read ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  Buffer::AddReaChain(&this->super_Buffer,pBStack_18);
  piVar6 = __errno_location();
  if ((*piVar6 != 0xb) && (piVar6 = __errno_location(), *piVar6 != 0xb)) {
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    poVar7 = std::operator<<(poVar7,":");
    piVar6 = __errno_location();
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*piVar6);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    (*(this->super_PollObj)._vptr_PollObj[8])();
    return;
  }
  TmpSend(this);
  (*(this->super_PollObj)._vptr_PollObj[7])();
  return;
}

Assistant:

void TcpConn::OnData()
{
    BufferChain* buff = this->Alloc();
    while (true)
    {    
        //TODO最后一次内存泄漏
        //既然用了et 这里要改 要一次性读完
        int ret = m_socket.read(buff->GetWriteAddr(), buff->GetCanWriteCount());
        if(ret < 0)
        {
            this->AddReaChain(buff);
            if(errno == EAGAIN || errno == EWOULDBLOCK)
            {
                break;
            }
            else
            {
                std::cout << ret << ":" << errno << std::endl;
                this->OnConnError();
                return;
            }
        }
        else if(ret == 0)
        {
            this->AddReaChain(buff);
            std::cout << ret << ":" << errno << std::endl;
            this->OnConnError();
            return;
        }
        buff->write += ret;
        if(buff->GetCanWriteCount() == 0)
        {
            this->AddReaChain(buff);
            buff = this->Alloc();
        }
        std::cout << "read " << ret << std::endl;

    }

    this->TmpSend();
    this->OnConnData();
}